

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_update_alleles(bcf_hdr_t *hdr,bcf1_t *line,char **alleles,int nals)

{
  char *pcVar1;
  int nals_00;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  char *__ptr;
  kstring_t local_48;
  
  local_48.l = 0;
  local_48.m = 0;
  local_48.s = (char *)0x0;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < nals) {
    uVar3 = nals;
  }
  uVar2 = (ulong)uVar3;
  do {
    if (uVar2 == uVar4) {
LAB_00118c79:
      pcVar1 = (line->d).als;
      __ptr = pcVar1;
      if (uVar3 == nals) {
        local_48.m = (size_t)(line->d).m_als;
        __ptr = (char *)0x0;
        local_48.s = pcVar1;
      }
      for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
        kputs(alleles[uVar4],&local_48);
        kputc(0,&local_48);
      }
      (line->d).als = local_48.s;
      (line->d).m_als = (int)local_48.m;
      free(__ptr);
      _bcf1_sync_alleles((bcf_hdr_t *)line,(bcf1_t *)(ulong)(uint)nals,nals_00);
      return 0;
    }
    pcVar1 = (line->d).als;
    if ((pcVar1 <= alleles[uVar4]) && (alleles[uVar4] < pcVar1 + (line->d).m_als)) {
      uVar3 = (uint)uVar4;
      goto LAB_00118c79;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int bcf_update_alleles(const bcf_hdr_t *hdr, bcf1_t *line, const char **alleles, int nals)
{
    kstring_t tmp = {0,0,0};
    char *free_old = NULL;

    // If the supplied alleles are not pointers to line->d.als, the existing block can be reused.
    int i;
    for (i=0; i<nals; i++)
        if ( alleles[i]>=line->d.als && alleles[i]<line->d.als+line->d.m_als ) break;
    if ( i==nals )
    {
        // all alleles point elsewhere, reuse the existing block
        tmp.l = 0; tmp.s = line->d.als; tmp.m = line->d.m_als;
    }
    else
        free_old = line->d.als;

    for (i=0; i<nals; i++)
    {
        kputs(alleles[i], &tmp);
        kputc(0, &tmp);
    }
    line->d.als = tmp.s; line->d.m_als = tmp.m;
    free(free_old);
    return _bcf1_sync_alleles(hdr,line,nals);
}